

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O1

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo7(Segment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double m10;
  double m01;
  double m00;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  uint64_t local_68;
  double local_60;
  uint64_t local_58 [5];
  
  local_60 = 0.0;
  local_80 = 0.0;
  local_70 = getNormalMoment(this,(uint64_t *)&local_60,(uint64_t *)&local_80);
  local_80 = 0.0;
  local_88 = 4.94065645841247e-324;
  local_60 = local_70;
  local_80 = getNormalMoment(this,(uint64_t *)&local_80,(uint64_t *)&local_88);
  local_88 = 4.94065645841247e-324;
  local_68 = 0;
  local_88 = getNormalMoment(this,(uint64_t *)&local_88,&local_68);
  local_68 = 2;
  local_58[4] = 0;
  local_78 = getCentralMoment(this,&local_68,local_58 + 4,&local_60,&local_88,&local_80);
  local_58[3] = 0;
  local_58[2] = 2;
  dVar1 = getCentralMoment(this,local_58 + 3,local_58 + 2,&local_60,&local_88,&local_80);
  local_58[1] = 1;
  local_58[0] = 1;
  dVar2 = getCentralMoment(this,local_58 + 1,local_58,&local_60,&local_88,&local_80);
  dVar1 = dVar1 * local_78;
  dVar3 = pow(local_70,4.0);
  return (dVar1 - dVar2 * dVar2) / dVar3;
}

Assistant:

const double
Segment::getHuMomentInvariantNo7()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            (
                this->getCentralMoment(2, 0, m00, m10, m01) *
                this->getCentralMoment(0, 2, m00, m10, m01)
            )
            -
            std::pow(
                this->getCentralMoment(1, 1, m00, m10, m01),
                2
            )
        )
        /
        std::pow(m00, 4)
    );
}